

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusplatformmenu.cpp
# Opt level: O0

void __thiscall QDBusPlatformMenuItem::QDBusPlatformMenuItem(QDBusPlatformMenuItem *this)

{
  long lVar1;
  undefined2 uVar2;
  int *in_RDI;
  long in_FS_OFFSET;
  QPlatformMenuItem *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QPlatformMenuItem::QPlatformMenuItem(in_stack_ffffffffffffffd0);
  *(undefined ***)in_RDI = &PTR_metaObject_00e26028;
  QString::QString((QString *)0xb17df0);
  QIcon::QIcon((QIcon *)(in_RDI + 0xc));
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  *(byte *)(in_RDI + 0x10) = *(byte *)(in_RDI + 0x10) & 0xf0;
  *(byte *)(in_RDI + 0x10) = *(byte *)(in_RDI + 0x10) | 0x10;
  *(byte *)(in_RDI + 0x10) = *(byte *)(in_RDI + 0x10) | 0x20;
  *(byte *)(in_RDI + 0x10) = *(byte *)(in_RDI + 0x10) & 0xbf;
  *(byte *)(in_RDI + 0x10) = *(byte *)(in_RDI + 0x10) & 0x7f;
  *(byte *)((long)in_RDI + 0x41) = *(byte *)((long)in_RDI + 0x41) & 0xfe;
  *(byte *)((long)in_RDI + 0x41) = *(byte *)((long)in_RDI + 0x41) & 0xfd;
  uVar2 = (undefined2)nextDBusID;
  nextDBusID = nextDBusID + 1;
  *(undefined2 *)((long)in_RDI + 0x42) = uVar2;
  QKeySequence::QKeySequence((QKeySequence *)0xb17e5e);
  QHash<int,_QDBusPlatformMenuItem_*>::insert
            ((QHash<int,_QDBusPlatformMenuItem_*> *)in_stack_ffffffffffffffd0,in_RDI,
             (QDBusPlatformMenuItem **)0xb17e85);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDBusPlatformMenuItem::QDBusPlatformMenuItem()
    : m_subMenu(nullptr)
    , m_role(NoRole)
    , m_isEnabled(true)
    , m_isVisible(true)
    , m_isSeparator(false)
    , m_isCheckable(false)
    , m_isChecked(false)
    , m_hasExclusiveGroup(false)
    , m_dbusID(nextDBusID++)
{
    menuItemsByID.insert(m_dbusID, this);
}